

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

pair<bool,_unsigned_long> __thiscall
CommentTokenizerRule::tryMatch(CommentTokenizerRule *this,shared_ptr<Readable> *reader)

{
  element_type *peVar1;
  unsigned_long uVar2;
  int iVar3;
  unsigned_long uVar4;
  ulong unaff_R15;
  pair<bool,_unsigned_long> pVar5;
  
  peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar3 = (*peVar1->_vptr_Readable[2])(peVar1,0);
  if ((char)iVar3 == '#') {
    uVar2 = 1;
    do {
      uVar4 = uVar2;
      peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = (*peVar1->_vptr_Readable[2])(peVar1,uVar4);
      unaff_R15 = CONCAT71((int7)(unaff_R15 >> 8),1);
      if (((char)iVar3 == '\0') ||
         (peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
         iVar3 = (*peVar1->_vptr_Readable[2])(peVar1,uVar4), (char)iVar3 == '\n')) break;
      peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = (*peVar1->_vptr_Readable[2])(peVar1,uVar4);
      uVar2 = uVar4 + 1;
    } while ((char)iVar3 != '\r');
  }
  else {
    unaff_R15 = 0;
    uVar4 = 0;
  }
  pVar5._0_8_ = unaff_R15 & 0xffffffff;
  pVar5.second = uVar4;
  return pVar5;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (reader->charAt(i) != '#') {
      return std::make_pair(false, 0);
    }

    i++;

    while (reader->charAt(i) != '\0' && reader->charAt(i) != '\n' && reader->charAt(i) != '\r') {
      i++;
    }

    return std::make_pair(true, i);
  }